

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr TIFFReadDirEntrySshortArray(TIFF *tif,TIFFDirEntry *direntry,int16_t **value)

{
  uint16_t uVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  uint64_t uVar5;
  short sVar6;
  TIFFReadDirEntryErr TVar7;
  int16_t *p;
  uint64_t *puVar8;
  long lVar9;
  uint32_t count;
  void *origdata;
  uint local_44;
  int16_t **local_40;
  uint64_t *local_38;
  
  TVar7 = TIFFReadDirEntryErrType;
  if ((direntry->tdir_type < 0x12) && ((0x3035aU >> (direntry->tdir_type & 0x1f) & 1) != 0)) {
    TVar7 = TIFFReadDirEntryArrayWithLimit(tif,direntry,&local_44,2,&local_38,0xffffffffffffffff);
    if (local_38 == (uint64_t *)0x0 || TVar7 != TIFFReadDirEntryErrOk) {
      *value = (int16_t *)0x0;
    }
    else if (direntry->tdir_type == 8) {
      *value = (int16_t *)local_38;
      TVar7 = TIFFReadDirEntryErrOk;
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabArrayOfShort((uint16_t *)local_38,(ulong)local_44);
      }
    }
    else {
      uVar4 = local_44;
      puVar8 = local_38;
      if (direntry->tdir_type == 3) {
        for (; uVar4 != 0; uVar4 = uVar4 - 1) {
          if ((tif->tif_flags & 0x80) != 0) {
            TIFFSwabShort((uint16_t *)puVar8);
          }
          uVar3 = (ushort)*puVar8 >> 0xd;
          if ((uVar3 & 4) != 0) {
            _TIFFfreeExt(tif,local_38);
            return uVar3 & TIFFReadDirEntryErrRange;
          }
          puVar8 = (uint64_t *)((long)puVar8 + 2);
        }
        *value = (int16_t *)local_38;
      }
      else {
        p = (int16_t *)_TIFFmallocExt(tif,(ulong)(local_44 * 2));
        if (p == (int16_t *)0x0) {
          _TIFFfreeExt(tif,local_38);
          return TIFFReadDirEntryErrAlloc;
        }
        uVar1 = direntry->tdir_type;
        local_40 = value;
        switch(uVar1) {
        case 1:
          if (local_44 != 0) {
            lVar9 = 0;
            do {
              p[lVar9] = (ushort)*(byte *)((long)local_38 + lVar9);
              lVar9 = lVar9 + 1;
            } while (local_44 != (uint)lVar9);
          }
          break;
        case 2:
        case 3:
        case 5:
        case 7:
        case 8:
          break;
        case 4:
          if (local_44 != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)puVar8);
              }
              uVar5 = *puVar8;
              if (0x7fff < (uint)uVar5) {
LAB_00295498:
                _TIFFfreeExt(tif,local_38);
                _TIFFfreeExt(tif,p);
                return TIFFReadDirEntryErrRange;
              }
              puVar8 = (uint64_t *)((long)puVar8 + 4);
              p[lVar9] = (int16_t)(uint)uVar5;
              lVar9 = lVar9 + 1;
            } while (local_44 != (uint)lVar9);
          }
          break;
        case 6:
          if (local_44 != 0) {
            lVar9 = 0;
            do {
              p[lVar9] = (short)*(char *)((long)local_38 + lVar9);
              lVar9 = lVar9 + 1;
            } while (local_44 != (uint)lVar9);
          }
          break;
        case 9:
          if (local_44 != 0) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)puVar8);
              }
              sVar6 = (short)(int)*puVar8;
              if ((int)sVar6 != (int)*puVar8) goto LAB_00295498;
              puVar8 = (uint64_t *)((long)puVar8 + 4);
              p[lVar9] = sVar6;
              lVar9 = lVar9 + 1;
            } while (local_44 != (uint)lVar9);
          }
          break;
        default:
          if (uVar1 == 0x10) {
            if (local_44 != 0) {
              lVar9 = 0;
              do {
                if ((tif->tif_flags & 0x80) != 0) {
                  TIFFSwabLong8(puVar8);
                }
                uVar2 = *puVar8;
                if (0x7fff < uVar2) goto LAB_00295498;
                puVar8 = puVar8 + 1;
                p[lVar9] = (int16_t)uVar2;
                lVar9 = lVar9 + 1;
              } while (local_44 != (uint)lVar9);
            }
          }
          else if ((uVar1 == 0x11) && (local_44 != 0)) {
            lVar9 = 0;
            do {
              if ((tif->tif_flags & 0x80) != 0) {
                TIFFSwabLong8(puVar8);
              }
              sVar6 = (short)*puVar8;
              if ((long)sVar6 != *puVar8) goto LAB_00295498;
              puVar8 = puVar8 + 1;
              p[lVar9] = sVar6;
              lVar9 = lVar9 + 1;
            } while (local_44 != (uint)lVar9);
          }
        }
        _TIFFfreeExt(tif,local_38);
        *local_40 = p;
      }
      TVar7 = TIFFReadDirEntryErrOk;
    }
  }
  return TVar7;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshortArray(TIFF *tif, TIFFDirEntry *direntry, int16_t **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    int16_t *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 2, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_SHORT:
        {
            uint16_t *m;
            uint32_t n;
            m = (uint16_t *)origdata;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(m);
                err = TIFFReadDirEntryCheckRangeSshortShort(*m);
                if (err != TIFFReadDirEntryErrOk)
                {
                    _TIFFfreeExt(tif, origdata);
                    return (err);
                }
                m++;
            }
            *value = (int16_t *)origdata;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            *value = (int16_t *)origdata;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfShort((uint16_t *)(*value), count);
            return (TIFFReadDirEntryErrOk);
    }
    data = (int16_t *)_TIFFmallocExt(tif, count * 2);
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (int16_t)(*ma++);
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
                err = TIFFReadDirEntryCheckRangeSshortLong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            int16_t *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                err = TIFFReadDirEntryCheckRangeSshortSlong8(*ma);
                if (err != TIFFReadDirEntryErrOk)
                    break;
                *mb++ = (int16_t)(*ma++);
            }
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    if (err != TIFFReadDirEntryErrOk)
    {
        _TIFFfreeExt(tif, data);
        return (err);
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}